

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O3

bool __thiscall
brotli::HashLongestMatch<15,_7,_10>::FindLongestMatch
          (HashLongestMatch<15,_7,_10> *this,uint8_t *data,size_t ring_buffer_mask,
          int *distance_cache,size_t cur_ix,size_t max_length,size_t max_backward,
          size_t *best_len_out,size_t *best_len_code_out,size_t *best_distance_out,
          double *best_score_out)

{
  int *piVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  size_t i;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  int *piVar24;
  size_t sVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  *best_len_code_out = 0;
  uVar23 = cur_ix & ring_buffer_mask;
  dVar26 = *best_score_out;
  uVar7 = *best_len_out;
  *best_len_out = 0;
  uVar19 = max_length & 0xfffffffffffffff8;
  uVar11 = (ulong)((uint)max_length & 7);
  piVar1 = (int *)(data + uVar23);
  bVar16 = false;
  uVar13 = 0;
  do {
    uVar22 = (long)(int)(&kDistanceCacheOffset)[uVar13] +
             (long)distance_cache[(uint)(&kDistanceCacheIndex)[uVar13]];
    if ((uVar22 <= max_backward && cur_ix - uVar22 < cur_ix) && (uVar7 + uVar23 <= ring_buffer_mask)
       ) {
      uVar10 = cur_ix - uVar22 & ring_buffer_mask;
      if ((uVar10 + uVar7 <= ring_buffer_mask) && (data[uVar7 + uVar23] == data[uVar10 + uVar7])) {
        if (7 < max_length) {
          lVar17 = 0;
          uVar20 = 0;
LAB_0012233f:
          if (*(ulong *)(piVar1 + uVar20 * 2) == *(ulong *)(data + uVar20 * 8 + uVar10))
          goto code_r0x00122351;
          uVar20 = *(ulong *)(data + uVar20 * 8 + uVar10) ^ *(ulong *)(piVar1 + uVar20 * 2);
          uVar10 = 0;
          if (uVar20 != 0) {
            for (; (uVar20 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
            }
          }
          uVar20 = (uVar10 >> 3 & 0x1fffffff) - lVar17;
          goto LAB_00122386;
        }
        uVar21 = 0;
        piVar24 = piVar1;
LAB_0012240e:
        uVar20 = uVar21;
        if (uVar11 != 0) {
          uVar14 = uVar21 | uVar11;
          uVar18 = uVar11;
          do {
            uVar20 = uVar21;
            if (data[uVar21 + uVar10] != (uint8_t)*piVar24) break;
            piVar24 = (int *)((long)piVar24 + 1);
            uVar21 = uVar21 + 1;
            uVar18 = uVar18 - 1;
            uVar20 = uVar14;
          } while (uVar18 != 0);
        }
LAB_00122386:
        if (((2 < uVar20) || ((uVar13 < 2 && (uVar20 == 2)))) &&
           (auVar28._8_4_ = (int)(uVar20 >> 0x20), auVar28._0_8_ = uVar20,
           auVar28._12_4_ = 0x45300000,
           dVar27 = ((auVar28._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar20) - 4503599627370496.0)) * 5.4 -
                    (double)(&BackwardReferenceScoreUsingLastDistance(unsigned_long,unsigned_long)::
                              kDistanceShortCodeBitCost)[uVar13], dVar26 < dVar27)) {
          *best_len_out = uVar20;
          *best_len_code_out = uVar20;
          *best_distance_out = uVar22;
          *best_score_out = dVar27;
          bVar16 = true;
          uVar7 = uVar20;
          dVar26 = dVar27;
        }
      }
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 10);
  uVar12 = (uint)(*piVar1 * 0x1e35a7bd) >> 0x11;
  uVar2 = this->num_[uVar12];
  uVar22 = (ulong)uVar2;
  uVar13 = 0;
  if (0x80 < uVar2) {
    uVar13 = (ulong)(uVar2 - 0x80);
  }
  if (uVar13 < uVar22) {
    do {
      uVar22 = uVar22 - 1;
      uVar3 = *(uint *)((long)this->buckets_[0] +
                       (ulong)((uint)uVar22 & 0x7f) * 4 + (ulong)(uVar12 << 9));
      uVar10 = cur_ix - uVar3;
      if ((uVar10 == 0) || (max_backward < uVar10)) break;
      if (uVar7 + uVar23 <= ring_buffer_mask) {
        uVar20 = (ulong)(uVar3 & (uint)ring_buffer_mask);
        if ((uVar7 + uVar20 <= ring_buffer_mask) && (data[uVar7 + uVar23] == data[uVar7 + uVar20]))
        {
          if (7 < max_length) {
            lVar17 = 0;
            uVar21 = 0;
LAB_001224f7:
            if (*(ulong *)(piVar1 + uVar21 * 2) == *(ulong *)(data + uVar21 * 8 + uVar20))
            goto code_r0x0012250a;
            uVar21 = *(ulong *)(data + uVar21 * 8 + uVar20) ^ *(ulong *)(piVar1 + uVar21 * 2);
            uVar20 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
              }
            }
            uVar21 = (uVar20 >> 3 & 0x1fffffff) - lVar17;
            goto LAB_00122548;
          }
          piVar24 = piVar1;
          uVar18 = 0;
LAB_001225c8:
          uVar21 = uVar18;
          if (uVar11 != 0) {
            uVar15 = uVar18 | uVar11;
            uVar14 = uVar11;
            do {
              uVar21 = uVar18;
              if (data[uVar18 + uVar20] != (uint8_t)*piVar24) break;
              piVar24 = (int *)((long)piVar24 + 1);
              uVar18 = uVar18 + 1;
              uVar14 = uVar14 - 1;
              uVar21 = uVar15;
            } while (uVar14 != 0);
          }
LAB_00122548:
          if (3 < uVar21) {
            auVar29._8_4_ = (int)(uVar21 >> 0x20);
            auVar29._0_8_ = uVar21;
            auVar29._12_4_ = 0x45300000;
            iVar4 = 0x1f;
            if ((uint)uVar10 != 0) {
              for (; (uint)uVar10 >> iVar4 == 0; iVar4 = iVar4 + -1) {
              }
            }
            dVar27 = ((auVar29._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar21) - 4503599627370496.0)) * 5.4 +
                     (double)iVar4 * -1.2;
            if (dVar26 < dVar27) {
              *best_len_out = uVar21;
              *best_len_code_out = uVar21;
              *best_distance_out = uVar10;
              *best_score_out = dVar27;
              bVar16 = true;
              uVar7 = uVar21;
              dVar26 = dVar27;
            }
          }
        }
      }
    } while (uVar13 < uVar22);
  }
  *(int *)((long)this->buckets_[0] + (ulong)(uVar2 & 0x7f) * 4 + (ulong)(uVar12 << 9)) = (int)cur_ix
  ;
  this->num_[uVar12] = uVar2 + 1;
  bVar6 = true;
  if (!bVar16) {
    uVar7 = this->num_dict_lookups_;
    uVar13 = this->num_dict_matches_;
    if (uVar13 < uVar7 >> 7) {
      bVar6 = false;
    }
    else {
      uVar19 = (ulong)(uVar12 & 0xfffffffe);
      bVar5 = true;
      bVar6 = bVar16;
      do {
        bVar16 = bVar5;
        uVar7 = uVar7 + 1;
        this->num_dict_lookups_ = uVar7;
        uVar2 = *(ushort *)(kStaticDictionaryHash + uVar19 * 2);
        if (uVar2 != 0) {
          uVar12 = uVar2 & 0x1f;
          uVar11 = (ulong)uVar12;
          if (uVar11 <= max_length) {
            puVar8 = kBrotliDictionary +
                     uVar11 * (uVar2 >> 5) + (ulong)kBrotliDictionaryOffsetsByLength[uVar11];
            if (7 < uVar12) {
              uVar22 = (ulong)(uVar2 & 0x18);
              puVar9 = puVar8 + uVar22;
              uVar23 = 0;
LAB_001226e1:
              if (*(ulong *)(puVar8 + uVar23) == *(ulong *)((long)piVar1 + uVar23))
              goto code_r0x001226f3;
              uVar10 = *(ulong *)((long)piVar1 + uVar23) ^ *(ulong *)(puVar8 + uVar23);
              uVar22 = 0;
              if (uVar10 != 0) {
                for (; (uVar10 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                }
              }
              uVar23 = (uVar22 >> 3 & 0x1fffffff) + uVar23;
              goto LAB_0012271c;
            }
            uVar22 = 0;
            puVar9 = puVar8;
LAB_001227d5:
            uVar10 = uVar11 & 7;
            uVar23 = uVar22;
            if ((uVar2 & 7) != 0) {
              uVar20 = uVar22 | uVar10;
              do {
                uVar23 = uVar22;
                if (*(uint8_t *)((long)piVar1 + uVar22) != *puVar9) break;
                puVar9 = puVar9 + 1;
                uVar22 = uVar22 + 1;
                uVar10 = uVar10 - 1;
                uVar23 = uVar20;
              } while (uVar10 != 0);
            }
LAB_0012271c:
            if ((uVar23 != 0) && (uVar11 < uVar23 + 10)) {
              sVar25 = (ulong)(uVar2 >> 5) + max_backward + 1 +
                       (long)(1 << (""[uVar11] & 0x1f)) *
                       (ulong)(byte)kCutoffTransforms[uVar11 - uVar23];
              auVar30._8_4_ = (int)(uVar23 >> 0x20);
              auVar30._0_8_ = uVar23;
              auVar30._12_4_ = 0x45300000;
              iVar4 = 0x1f;
              uVar12 = (uint)sVar25;
              if (uVar12 != 0) {
                for (; uVar12 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                }
              }
              dVar27 = ((auVar30._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar23) - 4503599627370496.0)) * 5.4 +
                       (double)iVar4 * -1.2;
              if (dVar26 < dVar27) {
                uVar13 = uVar13 + 1;
                this->num_dict_matches_ = uVar13;
                *best_len_out = uVar23;
                *best_len_code_out = uVar11;
                *best_distance_out = sVar25;
                *best_score_out = dVar27;
                bVar6 = true;
                dVar26 = dVar27;
              }
            }
          }
        }
        uVar19 = uVar19 + 1;
        bVar5 = false;
      } while (bVar16);
    }
  }
  return bVar6;
code_r0x00122351:
  uVar20 = uVar20 + 1;
  lVar17 = lVar17 + -8;
  uVar21 = uVar19;
  piVar24 = (int *)((long)piVar1 + uVar19);
  if (max_length >> 3 == uVar20) goto LAB_0012240e;
  goto LAB_0012233f;
code_r0x0012250a:
  uVar21 = uVar21 + 1;
  lVar17 = lVar17 + -8;
  piVar24 = (int *)((long)piVar1 + uVar19);
  uVar18 = uVar19;
  if (max_length >> 3 == uVar21) goto LAB_001225c8;
  goto LAB_001224f7;
code_r0x001226f3:
  uVar23 = uVar23 + 8;
  if (uVar22 == uVar23) goto LAB_001227d5;
  goto LAB_001226e1;
}

Assistant:

bool FindLongestMatch(const uint8_t * __restrict data,
                        const size_t ring_buffer_mask,
                        const int* __restrict distance_cache,
                        const size_t cur_ix,
                        const size_t max_length,
                        const size_t max_backward,
                        size_t * __restrict best_len_out,
                        size_t * __restrict best_len_code_out,
                        size_t * __restrict best_distance_out,
                        double * __restrict best_score_out) {
    *best_len_code_out = 0;
    const size_t cur_ix_masked = cur_ix & ring_buffer_mask;
    bool match_found = false;
    // Don't accept a short copy from far away.
    double best_score = *best_score_out;
    size_t best_len = *best_len_out;
    *best_len_out = 0;
    // Try last distance first.
    for (size_t i = 0; i < kNumLastDistancesToCheck; ++i) {
      const size_t idx = kDistanceCacheIndex[i];
      const size_t backward =
          static_cast<size_t>(distance_cache[idx] + kDistanceCacheOffset[i]);
      size_t prev_ix = static_cast<size_t>(cur_ix - backward);
      if (prev_ix >= cur_ix) {
        continue;
      }
      if (PREDICT_FALSE(backward > max_backward)) {
        continue;
      }
      prev_ix &= ring_buffer_mask;

      if (cur_ix_masked + best_len > ring_buffer_mask ||
          prev_ix + best_len > ring_buffer_mask ||
          data[cur_ix_masked + best_len] != data[prev_ix + best_len]) {
        continue;
      }
      const size_t len = FindMatchLengthWithLimit(&data[prev_ix],
                                                  &data[cur_ix_masked],
                                                  max_length);
      if (len >= 3 || (len == 2 && i < 2)) {
        // Comparing for >= 2 does not change the semantics, but just saves for
        // a few unnecessary binary logarithms in backward reference score,
        // since we are not interested in such short matches.
        double score = BackwardReferenceScoreUsingLastDistance(len, i);
        if (best_score < score) {
          best_score = score;
          best_len = len;
          *best_len_out = best_len;
          *best_len_code_out = best_len;
          *best_distance_out = backward;
          *best_score_out = best_score;
          match_found = true;
        }
      }
    }
    const uint32_t key = HashBytes(&data[cur_ix_masked]);
    const uint32_t * __restrict const bucket = &buckets_[key][0];
    const size_t down = (num_[key] > kBlockSize) ? (num_[key] - kBlockSize) : 0;
    for (size_t i = num_[key]; i > down;) {
      --i;
      size_t prev_ix = bucket[i & kBlockMask];
      const size_t backward = cur_ix - prev_ix;
      if (PREDICT_FALSE(backward == 0 || backward > max_backward)) {
        break;
      }
      prev_ix &= ring_buffer_mask;
      if (cur_ix_masked + best_len > ring_buffer_mask ||
          prev_ix + best_len > ring_buffer_mask ||
          data[cur_ix_masked + best_len] != data[prev_ix + best_len]) {
        continue;
      }
      const size_t len = FindMatchLengthWithLimit(&data[prev_ix],
                                                  &data[cur_ix_masked],
                                                  max_length);
      if (len >= 4) {
        // Comparing for >= 3 does not change the semantics, but just saves
        // for a few unnecessary binary logarithms in backward reference
        // score, since we are not interested in such short matches.
        double score = BackwardReferenceScore(len, backward);
        if (best_score < score) {
          best_score = score;
          best_len = len;
          *best_len_out = best_len;
          *best_len_code_out = best_len;
          *best_distance_out = backward;
          *best_score_out = best_score;
          match_found = true;
        }
      }
    }
    buckets_[key][num_[key] & kBlockMask] = static_cast<uint32_t>(cur_ix);
    ++num_[key];
    if (!match_found && num_dict_matches_ >= (num_dict_lookups_ >> 7)) {
      size_t dict_key = Hash<14>(&data[cur_ix_masked]) << 1;
      for (int k = 0; k < 2; ++k, ++dict_key) {
        ++num_dict_lookups_;
        const uint16_t v = kStaticDictionaryHash[dict_key];
        if (v > 0) {
          const size_t len = v & 31;
          const size_t dist = v >> 5;
          const size_t offset =
              kBrotliDictionaryOffsetsByLength[len] + len * dist;
          if (len <= max_length) {
            const size_t matchlen =
                FindMatchLengthWithLimit(&data[cur_ix_masked],
                                         &kBrotliDictionary[offset], len);
            if (matchlen + kCutoffTransformsCount > len && matchlen > 0) {
              const size_t transform_id = kCutoffTransforms[len - matchlen];
              const size_t word_id =
                  transform_id * (1 << kBrotliDictionarySizeBitsByLength[len]) +
                  dist;
              const size_t backward = max_backward + word_id + 1;
              double score = BackwardReferenceScore(matchlen, backward);
              if (best_score < score) {
                ++num_dict_matches_;
                best_score = score;
                best_len = matchlen;
                *best_len_out = best_len;
                *best_len_code_out = len;
                *best_distance_out = backward;
                *best_score_out = best_score;
                match_found = true;
              }
            }
          }
        }
      }
    }
    return match_found;
  }